

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O1

void __thiscall HEkkDualRHS::createInfeasList(HEkkDualRHS *this,double columnDensity)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  HEkk *pHVar4;
  pointer pcVar5;
  pointer pdVar6;
  pointer piVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  size_t __n;
  double dVar14;
  double dVar15;
  double dVar16;
  
  iVar1 = (this->ekk_instance_->lp_).num_row_;
  __n = (size_t)iVar1;
  pdVar3 = (this->ekk_instance_->scattered_dual_edge_weight_).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (0 < (long)__n) {
    memset((this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,0,__n);
  }
  this->workCount = 0;
  this->workCutoff = 0.0;
  if (0 < iVar1) {
    sVar9 = 0;
    do {
      dVar16 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[sVar9];
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[sVar9] = '\x01';
        iVar2 = this->workCount;
        this->workCount = iVar2 + 1;
        (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar2] = (int)sVar9;
      }
      sVar9 = sVar9 + 1;
    } while (__n != sVar9);
  }
  if (columnDensity < 0.05) {
    iVar2 = this->workCount;
    uVar10 = (ulong)iVar2;
    dVar15 = (double)iVar1 * 0.01;
    dVar16 = 500.0;
    if (500.0 <= dVar15) {
      dVar16 = dVar15;
    }
    if (dVar16 < (double)iVar2) {
      pHVar4 = this->ekk_instance_;
      dVar15 = (double)iVar2 * 0.001;
      dVar16 = 500.0;
      if (500.0 <= dVar15) {
        dVar16 = dVar15;
      }
      iVar13 = (int)dVar16;
      if (iVar1 < 1) {
        dVar16 = 0.0;
      }
      else {
        pcVar5 = (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar9 = 0;
        iVar11 = 0;
        dVar15 = 0.0;
        do {
          dVar16 = dVar15;
          if (pcVar5[sVar9] != '\0') {
            dVar14 = pdVar6[sVar9] /
                     (pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar9];
            dVar16 = dVar14;
            if (dVar14 <= dVar15) {
              dVar16 = dVar15;
            }
            lVar12 = (long)iVar11;
            iVar11 = iVar11 + 1;
            pdVar3[lVar12] = -dVar14;
          }
          sVar9 = sVar9 + 1;
          dVar15 = dVar16;
        } while (__n != sVar9);
        dVar16 = dVar16 * 0.99999;
      }
      lVar12 = (long)iVar13;
      if ((iVar2 != 0) && (iVar2 != iVar13)) {
        lVar8 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::__introselect<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pdVar3,pdVar3 + lVar12,pdVar3 + uVar10,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      }
      dVar15 = pdVar3[lVar12];
      dVar14 = dVar15 * -1.00001;
      if (dVar16 <= dVar14) {
        dVar14 = dVar16;
      }
      this->workCutoff = dVar14;
      if (0 < iVar1) {
        memset((this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,0,__n);
      }
      this->workCount = 0;
      if (0 < iVar1) {
        sVar9 = 0;
        do {
          if ((pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar9] * this->workCutoff <=
              (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[sVar9]) {
            iVar2 = this->workCount;
            this->workCount = iVar2 + 1;
            (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2] = (int)sVar9;
            (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[sVar9] = '\x01';
          }
          sVar9 = sVar9 + 1;
        } while (__n != sVar9);
      }
      iVar2 = this->workCount;
      if (((double)iVar13 * 1.5 < (double)iVar2) && (this->workCount = iVar13, iVar13 < iVar2)) {
        do {
          piVar7 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar13 = piVar7[lVar12];
          if ((this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[iVar13] <=
              (pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar13] * -dVar15) {
            (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[iVar13] = '\0';
          }
          else {
            iVar11 = this->workCount;
            this->workCount = iVar11 + 1;
            piVar7[iVar11] = iVar13;
          }
          lVar12 = lVar12 + 1;
        } while (iVar2 != lVar12);
      }
    }
  }
  if ((double)iVar1 * 0.2 < (double)this->workCount) {
    this->workCount = -iVar1;
    this->workCutoff = 0.0;
  }
  return;
}

Assistant:

void HEkkDualRHS::createInfeasList(double columnDensity) {
  HighsInt numRow = ekk_instance_.lp_.num_row_;
  double* dwork = ekk_instance_.scattered_dual_edge_weight_.data();

  // 1. Build the full list
  fill_n(workMark.data(), numRow, 0);
  workCount = 0;
  workCutoff = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    if (work_infeasibility[iRow]) {
      workMark[iRow] = 1;
      workIndex[workCount++] = iRow;
    }
  }

  // 2. See if it worth to try to go sparse
  //    (Many candidates, really sparse RHS)
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount > max(numRow * 0.01, 500.0) && columnDensity < 0.05) {
    HighsInt icutoff = max(workCount * 0.001, 500.0);
    double maxMerit = 0;
    for (HighsInt iRow = 0, iPut = 0; iRow < numRow; iRow++)
      if (workMark[iRow]) {
        double myMerit = work_infeasibility[iRow] / edge_weight[iRow];
        if (maxMerit < myMerit) maxMerit = myMerit;
        dwork[iPut++] = -myMerit;
      }
    nth_element(dwork, dwork + icutoff, dwork + workCount);
    double cutMerit = -dwork[icutoff];
    workCutoff = min(maxMerit * 0.99999, cutMerit * 1.00001);

    // Create again
    fill_n(workMark.data(), numRow, 0);
    workCount = 0;
    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
      if (work_infeasibility[iRow] >= edge_weight[iRow] * workCutoff) {
        workIndex[workCount++] = iRow;
        workMark[iRow] = 1;
      }
    }

    // Reduce by drop smaller
    if (workCount > icutoff * 1.5) {
      // Firstly take up "icutoff" number of elements
      HighsInt fullCount = workCount;
      workCount = icutoff;
      for (HighsInt i = icutoff; i < fullCount; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > edge_weight[iRow] * cutMerit) {
          workIndex[workCount++] = iRow;
        } else {
          workMark[iRow] = 0;
        }
      }
    }
  }

  // 3. If there are still too many candidates: disable them
  if (workCount > 0.2 * numRow) {
    workCount = -numRow;
    workCutoff = 0;
  }
}